

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O3

int png_write_image_8bit(png_voidp argument)

{
  ushort uVar1;
  undefined8 *puVar2;
  png_structrp png_ptr;
  png_const_bytep row;
  png_byte pVar3;
  uint uVar4;
  uint uVar5;
  png_const_bytep ppVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint alpha;
  int iVar10;
  int iVar11;
  uint reciprocal;
  int iVar12;
  ushort *puVar13;
  ushort *local_70;
  
  puVar2 = *argument;
  local_70 = *(ushort **)((long)argument + 0x28);
  png_ptr = *(png_structrp *)*puVar2;
  row = *(png_const_bytep *)((long)argument + 0x38);
  iVar10 = *(int *)(puVar2 + 2);
  uVar8 = *(uint *)((long)puVar2 + 0x14);
  uVar9 = (ulong)(uVar8 & 2) + 1;
  if ((uVar8 & 1) == 0) {
    if (iVar10 != 0) {
      iVar11 = *(int *)((long)puVar2 + 0xc);
      do {
        ppVar6 = row;
        puVar13 = local_70;
        if (iVar11 != 0) {
          do {
            uVar8 = (uint)*puVar13 * 0xff >> 0xf;
            *ppVar6 = (png_byte)
                      (((uint)png_sRGB_delta[uVar8] * ((uint)*puVar13 * 0xff & 0x7fff) >> 0xc) +
                       (uint)png_sRGB_base[uVar8] >> 8);
            ppVar6 = ppVar6 + 1;
            puVar13 = puVar13 + 1;
          } while (ppVar6 < row + (uint)((int)uVar9 * iVar11));
        }
        png_write_row(png_ptr,row);
        local_70 = (ushort *)((long)local_70 + (ulong)(*(uint *)((long)argument + 0x30) & 0xfffe));
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
  }
  else {
    uVar7 = uVar8 & 0x20;
    if (iVar10 != 0) {
      uVar9 = -(ulong)(uVar7 != 0) | uVar9;
      iVar11 = (uVar8 & 2) + 2;
      uVar8 = *(int *)((long)puVar2 + 0xc) * iVar11;
      local_70 = (ushort *)((long)local_70 + (ulong)(uVar7 >> 4));
      do {
        ppVar6 = row + (uVar7 >> 5);
        puVar13 = local_70;
        if (uVar8 != 0) {
          do {
            uVar1 = *(ushort *)((long)puVar13 + uVar9 * 2);
            alpha = (uint)uVar1;
            uVar4 = (alpha * 0x100 - (uint)uVar1) + 0x807f;
            reciprocal = 0;
            uVar5 = uVar4 >> 0x10;
            ppVar6[uVar9] = (png_byte)(uVar4 >> 0x10);
            if ((uVar5 != 0) && (uVar5 != 0xff)) {
              reciprocal = ((uVar1 >> 1) + 0x7f7f8080) / alpha;
            }
            puVar13 = (ushort *)((long)puVar13 + 2);
            ppVar6 = ppVar6 + 1;
            iVar12 = iVar11;
            do {
              pVar3 = png_unpremultiply((uint)*(ushort *)((long)puVar13 + -2),alpha,reciprocal);
              ppVar6[-1] = pVar3;
              puVar13 = (ushort *)((long)puVar13 + 2);
              ppVar6 = ppVar6 + 1;
              iVar12 = iVar12 + -1;
            } while (1 < iVar12);
          } while (ppVar6 < row + (uVar7 >> 5) + uVar8);
        }
        png_write_row(png_ptr,*(png_const_bytep *)((long)argument + 0x38));
        local_70 = (ushort *)((long)local_70 + (ulong)(*(uint *)((long)argument + 0x30) & 0xfffe));
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
  }
  return 1;
}

Assistant:

static int
png_write_image_8bit(png_voidp argument)
{
   png_image_write_control *display = png_voidcast(png_image_write_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;

   png_const_uint_16p input_row = png_voidcast(png_const_uint_16p,
       display->first_row);
   png_bytep output_row = png_voidcast(png_bytep, display->local_row);
   png_uint_32 y = image->height;
   unsigned int channels = (image->format & PNG_FORMAT_FLAG_COLOR) != 0 ?
       3 : 1;

   if ((image->format & PNG_FORMAT_FLAG_ALPHA) != 0)
   {
      png_bytep row_end;
      int aindex;

#   ifdef PNG_SIMPLIFIED_WRITE_AFIRST_SUPPORTED
      if ((image->format & PNG_FORMAT_FLAG_AFIRST) != 0)
      {
         aindex = -1;
         ++input_row; /* To point to the first component */
         ++output_row;
      }

      else
#   endif
      aindex = (int)channels;

      /* Use row_end in place of a loop counter: */
      row_end = output_row + image->width * (channels+1);

      for (; y > 0; --y)
      {
         png_const_uint_16p in_ptr = input_row;
         png_bytep out_ptr = output_row;

         while (out_ptr < row_end)
         {
            png_uint_16 alpha = in_ptr[aindex];
            png_byte alphabyte = (png_byte)PNG_DIV257(alpha);
            png_uint_32 reciprocal = 0;
            int c;

            /* Scale and write the alpha channel. */
            out_ptr[aindex] = alphabyte;

            if (alphabyte > 0 && alphabyte < 255)
               reciprocal = UNP_RECIPROCAL(alpha);

            c = (int)channels;
            do /* always at least one channel */
               *out_ptr++ = png_unpremultiply(*in_ptr++, alpha, reciprocal);
            while (--c > 0);

            /* Skip to next component (skip the intervening alpha channel) */
            ++in_ptr;
            ++out_ptr;
         } /* while out_ptr < row_end */

         png_write_row(png_ptr, png_voidcast(png_const_bytep,
             display->local_row));
         input_row += (png_uint_16)display->row_bytes/(sizeof (png_uint_16));
      } /* while y */
   }

   else
   {
      /* No alpha channel, so the row_end really is the end of the row and it
       * is sufficient to loop over the components one by one.
       */
      png_bytep row_end = output_row + image->width * channels;

      for (; y > 0; --y)
      {
         png_const_uint_16p in_ptr = input_row;
         png_bytep out_ptr = output_row;

         while (out_ptr < row_end)
         {
            png_uint_32 component = *in_ptr++;

            component *= 255;
            *out_ptr++ = (png_byte)PNG_sRGB_FROM_LINEAR(component);
         }

         png_write_row(png_ptr, output_row);
         input_row += (png_uint_16)display->row_bytes/(sizeof (png_uint_16));
      }
   }

   return 1;
}